

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  ptrdiff_t *ppVar8;
  byte *unaff_R15;
  bool bVar9;
  
  iVar3 = ms->depth;
  ms->depth = iVar3 + 1;
  if (199 < iVar3) {
    lj_err_caller(ms->L,LJ_ERR_STRPATX);
  }
LAB_0014e73a:
  switch(*p) {
  case '$':
    if (((byte *)p)[1] == 0) {
      if (s != ms->src_end) {
        s = (char *)(byte *)0x0;
      }
      goto LAB_0014eab0;
    }
    break;
  case '%':
    bVar1 = ((byte *)p)[1];
    if ((ulong)bVar1 == 0x66) goto LAB_0014e7ea;
    if (bVar1 == 0x62) {
      bVar1 = ((byte *)p)[2];
      if ((bVar1 == 0) || (((byte *)p)[3] == 0)) {
        lj_err_caller(ms->L,LJ_ERR_STRPATU);
      }
      if (*s == bVar1) {
        pbVar5 = (byte *)s + 1;
        if (pbVar5 < ms->src_end) {
          iVar3 = 1;
          do {
            if (*pbVar5 == ((byte *)p)[3]) {
              iVar3 = iVar3 + -1;
              if (iVar3 == 0) {
                s = (char *)(pbVar5 + 1);
                goto LAB_0014e7cf;
              }
            }
            else {
              iVar3 = iVar3 + (uint)(*pbVar5 == bVar1);
            }
            pbVar5 = pbVar5 + 1;
          } while (pbVar5 != (byte *)ms->src_end);
        }
      }
      s = (char *)0x0;
LAB_0014e7cf:
      if ((byte *)s != (byte *)0x0) {
        p = (char *)((byte *)p + 4);
        goto LAB_0014e73a;
      }
    }
    else {
      if ((""[(ulong)bVar1 + 1] & 8) == 0) break;
      if (((bVar1 < 0x31) || (uVar4 = bVar1 - 0x31, ms->level <= (int)uVar4)) ||
         (ms->capture[uVar4].len == -1)) {
        lj_err_caller(ms->L,LJ_ERR_STRCAPI);
      }
      uVar7 = ms->capture[uVar4].len;
      if ((ulong)((long)ms->src_end - (long)s) < uVar7) {
        s = (char *)0x0;
      }
      else {
        iVar3 = bcmp(ms->capture[uVar4].init,s,uVar7);
        s = (char *)((byte *)s + uVar7);
        if (iVar3 != 0) {
          s = (char *)0x0;
        }
      }
      if ((byte *)s != (byte *)0x0) {
        p = (char *)((byte *)p + 2);
        goto LAB_0014e73a;
      }
    }
    s = (char *)(byte *)0x0;
    goto LAB_0014eab0;
  case '&':
  case '\'':
    break;
  case '(':
    if (((byte *)p)[1] == 0x29) {
      pbVar5 = (byte *)p + 2;
      iVar3 = -2;
    }
    else {
      pbVar5 = (byte *)p + 1;
      iVar3 = -1;
    }
    s = start_capture(ms,s,(char *)pbVar5,iVar3);
    goto LAB_0014eab0;
  case ')':
    uVar7 = (ulong)(uint)ms->level;
    ppVar8 = &ms->capture[uVar7 - 1].len;
    do {
      if ((int)uVar7 < 1) {
        lj_err_caller(ms->L,LJ_ERR_STRPATC);
      }
      uVar7 = uVar7 - 1;
      lVar2 = *ppVar8;
      ppVar8 = ppVar8 + -2;
    } while (lVar2 != -1);
    uVar7 = uVar7 & 0xffffffff;
    ms->capture[uVar7].len = (long)s - (long)ms->capture[uVar7].init;
    s = match(ms,s,(char *)((byte *)p + 1));
    if ((byte *)s == (byte *)0x0) {
      ms->capture[uVar7].len = -1;
    }
LAB_0014eab0:
    ms->depth = ms->depth + -1;
    return (char *)(byte *)s;
  default:
    if (*p == 0) goto LAB_0014eab0;
  }
  pbVar5 = (byte *)classend(ms,p);
  if (s < ms->src_end) {
    iVar3 = singlematch((uint)(byte)*s,p,(char *)pbVar5);
    bVar9 = iVar3 != 0;
  }
  else {
    bVar9 = false;
  }
  bVar1 = *pbVar5;
  if (bVar1 < 0x2d) {
    if (bVar1 == 0x2a) {
LAB_0014e87a:
      s = max_expand(ms,s,p,(char *)pbVar5);
      bVar9 = false;
    }
    else {
      if (bVar1 == 0x2b) {
        if (bVar9) {
          s = (char *)((byte *)s + 1);
          goto LAB_0014e87a;
        }
      }
      else {
LAB_0014e8f6:
        if (bVar9) {
          s = (char *)((byte *)s + 1);
          goto LAB_0014e929;
        }
      }
      bVar9 = false;
      s = (char *)(byte *)0x0;
    }
  }
  else if (bVar1 == 0x3f) {
    if ((bVar9) &&
       (pbVar6 = (byte *)match(ms,(char *)((byte *)s + 1),(char *)(pbVar5 + 1)),
       pbVar6 != (byte *)0x0)) {
      bVar9 = false;
      s = (char *)pbVar6;
    }
    else {
      pbVar5 = pbVar5 + 1;
LAB_0014e929:
      bVar9 = true;
      p = (char *)pbVar5;
    }
  }
  else {
    if (bVar1 != 0x2d) goto LAB_0014e8f6;
    do {
      pbVar6 = (byte *)match(ms,s,(char *)(pbVar5 + 1));
      if (pbVar6 == (byte *)0x0) {
        if ((s < ms->src_end) && (iVar3 = singlematch((uint)(byte)*s,p,(char *)pbVar5), iVar3 != 0))
        {
          s = (char *)((byte *)s + 1);
          bVar9 = true;
        }
        else {
          unaff_R15 = (byte *)0x0;
          bVar9 = false;
        }
      }
      else {
        bVar9 = false;
        unaff_R15 = pbVar6;
      }
    } while (bVar9);
    bVar9 = false;
    s = (char *)unaff_R15;
  }
  if (!bVar9) goto LAB_0014eab0;
  goto LAB_0014e73a;
LAB_0014e7ea:
  if (((byte *)p)[2] != 0x5b) {
    lj_err_caller(ms->L,LJ_ERR_STRPATB);
  }
  pbVar5 = (byte *)p + 2;
  p = classend(ms,(char *)pbVar5);
  if (s == ms->src_init) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)((byte *)s)[-1];
  }
  iVar3 = matchbracketclass(uVar4,(char *)pbVar5,(char *)((byte *)p + -1));
  unaff_R15 = (byte *)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
  if ((iVar3 == 0) &&
     (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar5,(char *)((byte *)p + -1)), iVar3 != 0)
     ) {
    unaff_R15 = (byte *)0x0;
  }
  else {
    s = (char *)0x0;
    p = (char *)pbVar5;
  }
  if ((char)unaff_R15 != '\0') goto LAB_0014eab0;
  goto LAB_0014e73a;
}

Assistant:

static const char *match(MatchState *ms, const char *s, const char *p)
{
  if (++ms->depth > LJ_MAX_XLEVEL)
    lj_err_caller(ms->L, LJ_ERR_STRPATX);
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
  case '(':  /* start capture */
    if (*(p+1) == ')')  /* position capture? */
      s = start_capture(ms, s, p+2, CAP_POSITION);
    else
      s = start_capture(ms, s, p+1, CAP_UNFINISHED);
    break;
  case ')':  /* end capture */
    s = end_capture(ms, s, p+1);
    break;
  case L_ESC:
    switch (*(p+1)) {
    case 'b':  /* balanced string? */
      s = matchbalance(ms, s, p+2);
      if (s == NULL) break;
      p+=4;
      goto init;  /* else s = match(ms, s, p+4); */
    case 'f': {  /* frontier? */
      const char *ep; char previous;
      p += 2;
      if (*p != '[')
	lj_err_caller(ms->L, LJ_ERR_STRPATB);
      ep = classend(ms, p);  /* points to what is next */
      previous = (s == ms->src_init) ? '\0' : *(s-1);
      if (matchbracketclass(uchar(previous), p, ep-1) ||
	 !matchbracketclass(uchar(*s), p, ep-1)) { s = NULL; break; }
      p=ep;
      goto init;  /* else s = match(ms, s, ep); */
      }
    default:
      if (lj_char_isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
	s = match_capture(ms, s, uchar(*(p+1)));
	if (s == NULL) break;
	p+=2;
	goto init;  /* else s = match(ms, s, p+2) */
      }
      goto dflt;  /* case default */
    }
    break;
  case '\0':  /* end of pattern */
    break;  /* match succeeded */
  case '$':
    /* is the `$' the last char in pattern? */
    if (*(p+1) != '\0') goto dflt;
    if (s != ms->src_end) s = NULL;  /* check end of string */
    break;
  default: dflt: {  /* it is a pattern item */
    const char *ep = classend(ms, p);  /* points to what is next */
    int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
    switch (*ep) {
    case '?': {  /* optional */
      const char *res;
      if (m && ((res=match(ms, s+1, ep+1)) != NULL)) {
	s = res;
	break;
      }
      p=ep+1;
      goto init;  /* else s = match(ms, s, ep+1); */
      }
    case '*':  /* 0 or more repetitions */
      s = max_expand(ms, s, p, ep);
      break;
    case '+':  /* 1 or more repetitions */
      s = (m ? max_expand(ms, s+1, p, ep) : NULL);
      break;
    case '-':  /* 0 or more repetitions (minimum) */
      s = min_expand(ms, s, p, ep);
      break;
    default:
      if (m) { s++; p=ep; goto init; }  /* else s = match(ms, s+1, ep); */
      s = NULL;
      break;
    }
    break;
    }
  }
  ms->depth--;
  return s;
}